

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

void vkt::sr::anon_unknown_0::swizzlePixels
               (PixelBufferAccess *dst,ConstPixelBufferAccess *src,MaybeTextureSwizzle *swizzle)

{
  ChannelType CVar1;
  undefined4 in_EAX;
  int i_2;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int z;
  int y;
  int iVar5;
  int x;
  int iVar6;
  undefined1 auVar7 [16];
  float fVar8;
  undefined1 local_60 [24];
  ConstPixelBufferAccess *local_48;
  Vector<float,_4> result;
  
  local_60._16_8_ = dst;
  if ((swizzle->m_isSome != true) ||
     (auVar7._0_4_ = -(uint)((swizzle->m_swizzle).m_data[0] == FUNCTION_DRAW),
     auVar7._4_4_ = -(uint)((swizzle->m_swizzle).m_data[1] == FUNCTION_DRAW_INDEXED),
     auVar7._8_4_ = -(uint)((swizzle->m_swizzle).m_data[2] == FUNCTION_DRAW_INDIRECT),
     auVar7._12_4_ = -(uint)((swizzle->m_swizzle).m_data[3] == FUNCTION_DRAW_INDEXED_INDIRECT),
     iVar2 = movmskps(in_EAX,auVar7), iVar2 == 0xf)) {
    tcu::copy((EVP_PKEY_CTX *)dst,(EVP_PKEY_CTX *)src);
    return;
  }
  CVar1 = (dst->super_ConstPixelBufferAccess).m_format.type;
  uVar3 = (ulong)CVar1;
  local_48 = src;
  if (uVar3 < 0x22) {
    if ((0x58UL >> (uVar3 & 0x3f) & 1) != 0) {
      for (iVar2 = 0; iVar2 < (src->m_size).m_data[2]; iVar2 = iVar2 + 1) {
        for (iVar5 = 0; iVar5 < (src->m_size).m_data[1]; iVar5 = iVar5 + 1) {
          for (iVar6 = 0; iVar6 < (src->m_size).m_data[0]; iVar6 = iVar6 + 1) {
            tcu::ConstPixelBufferAccess::getPixelT<float>
                      ((ConstPixelBufferAccess *)local_60,(int)src,iVar6,iVar5);
            tcu::Vector<float,_4>::Vector(&result);
            for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
              switch((swizzle->m_swizzle).m_data[lVar4]) {
              case TEXTURESWIZZLECOMPONENT_R:
                fVar8 = (float)local_60._0_4_;
                break;
              case TEXTURESWIZZLECOMPONENT_G:
                fVar8 = (float)local_60._4_4_;
                break;
              case TEXTURESWIZZLECOMPONENT_B:
                fVar8 = (float)local_60._8_4_;
                break;
              case TEXTURESWIZZLECOMPONENT_A:
                fVar8 = (float)local_60._12_4_;
                break;
              case TEXTURESWIZZLECOMPONENT_ZERO:
                fVar8 = 0.0;
                break;
              case TEXTURESWIZZLECOMPONENT_ONE:
                fVar8 = 1.0;
                break;
              default:
                fVar8 = -1.0;
              }
              result.m_data[lVar4] = fVar8;
            }
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_60._16_8_,&result,iVar6,iVar5,iVar2);
            src = local_48;
          }
        }
      }
      return;
    }
    if ((0x2c0000000U >> (uVar3 & 0x3f) & 1) != 0) {
      for (iVar2 = 0; iVar2 < (src->m_size).m_data[2]; iVar2 = iVar2 + 1) {
        for (iVar5 = 0; iVar5 < (src->m_size).m_data[1]; iVar5 = iVar5 + 1) {
          for (iVar6 = 0; iVar6 < (src->m_size).m_data[0]; iVar6 = iVar6 + 1) {
            tcu::ConstPixelBufferAccess::getPixelT<unsigned_int>
                      ((ConstPixelBufferAccess *)local_60,(int)src,iVar6,iVar5);
            tcu::Vector<unsigned_int,_4>::Vector((Vector<unsigned_int,_4> *)&result);
            for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
              switch((swizzle->m_swizzle).m_data[lVar4]) {
              case TEXTURESWIZZLECOMPONENT_R:
                fVar8 = (float)local_60._0_4_;
                break;
              case TEXTURESWIZZLECOMPONENT_G:
                fVar8 = (float)local_60._4_4_;
                break;
              case TEXTURESWIZZLECOMPONENT_B:
                fVar8 = (float)local_60._8_4_;
                break;
              case TEXTURESWIZZLECOMPONENT_A:
                fVar8 = (float)local_60._12_4_;
                break;
              case TEXTURESWIZZLECOMPONENT_ZERO:
                fVar8 = 0.0;
                break;
              case TEXTURESWIZZLECOMPONENT_ONE:
                fVar8 = 1.4013e-45;
                break;
              default:
                fVar8 = -NAN;
              }
              result.m_data[lVar4] = fVar8;
            }
            tcu::PixelBufferAccess::setPixel
                      ((PixelBufferAccess *)local_60._16_8_,(UVec4 *)&result,iVar6,iVar5,iVar2);
            src = local_48;
          }
        }
      }
      return;
    }
  }
  if (CVar1 - SIGNED_INT8 < 3) {
    for (iVar2 = 0; iVar2 < (src->m_size).m_data[2]; iVar2 = iVar2 + 1) {
      for (iVar5 = 0; iVar5 < (src->m_size).m_data[1]; iVar5 = iVar5 + 1) {
        for (iVar6 = 0; iVar6 < (src->m_size).m_data[0]; iVar6 = iVar6 + 1) {
          tcu::ConstPixelBufferAccess::getPixelT<int>
                    ((ConstPixelBufferAccess *)local_60,(int)src,iVar6,iVar5);
          tcu::Vector<int,_4>::Vector((Vector<int,_4> *)&result);
          for (lVar4 = 0; lVar4 != 4; lVar4 = lVar4 + 1) {
            switch((swizzle->m_swizzle).m_data[lVar4]) {
            case TEXTURESWIZZLECOMPONENT_R:
              fVar8 = (float)local_60._0_4_;
              break;
            case TEXTURESWIZZLECOMPONENT_G:
              fVar8 = (float)local_60._4_4_;
              break;
            case TEXTURESWIZZLECOMPONENT_B:
              fVar8 = (float)local_60._8_4_;
              break;
            case TEXTURESWIZZLECOMPONENT_A:
              fVar8 = (float)local_60._12_4_;
              break;
            case TEXTURESWIZZLECOMPONENT_ZERO:
              fVar8 = 0.0;
              break;
            case TEXTURESWIZZLECOMPONENT_ONE:
              fVar8 = 1.4013e-45;
              break;
            default:
              fVar8 = -NAN;
            }
            result.m_data[lVar4] = fVar8;
          }
          tcu::PixelBufferAccess::setPixel
                    ((PixelBufferAccess *)local_60._16_8_,(IVec4 *)&result,iVar6,iVar5,iVar2);
          src = local_48;
        }
      }
    }
  }
  return;
}

Assistant:

static void swizzlePixels (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, const MaybeTextureSwizzle& swizzle)
{
	if (isDepthFormat(dst.getFormat()))
		DE_ASSERT(swizzle.isNone() || swizzle.isIdentitySwizzle());

	if (swizzle.isNone() || swizzle.isIdentitySwizzle())
		tcu::copy(dst, src);
	else if (isUnormFormatType(dst.getFormat().type))
		swizzlePixels<float>(dst, src, swizzle);
	else if (isUIntFormatType(dst.getFormat().type))
		swizzlePixels<deUint32>(dst, src, swizzle);
	else if (isSIntFormatType(dst.getFormat().type))
		swizzlePixels<deInt32>(dst, src, swizzle);
	else
		DE_ASSERT(false);
}